

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::getDHPublicKey
          (SoftHSM *this,DHPublicKey *publicKey,DHPrivateKey *privateKey,ByteString *pubParams)

{
  CK_RV CVar1;
  undefined8 uVar2;
  
  CVar1 = 7;
  if (privateKey != (DHPrivateKey *)0x0 && publicKey != (DHPublicKey *)0x0) {
    uVar2 = (**(code **)(*(long *)privateKey + 0x60))(privateKey);
    (**(code **)(*(long *)publicKey + 0x30))(publicKey,uVar2);
    uVar2 = (**(code **)(*(long *)privateKey + 0x68))(privateKey);
    (**(code **)(*(long *)publicKey + 0x38))(publicKey,uVar2);
    (**(code **)(*(long *)publicKey + 0x40))(publicKey,pubParams);
    CVar1 = 0;
  }
  return CVar1;
}

Assistant:

CK_RV SoftHSM::getDHPublicKey(DHPublicKey* publicKey, DHPrivateKey* privateKey, ByteString& pubParams)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (privateKey == NULL) return CKR_ARGUMENTS_BAD;

	// Copy Domain Parameters from Private Key
	publicKey->setP(privateKey->getP());
	publicKey->setG(privateKey->getG());

	// Set value
	publicKey->setY(pubParams);

	return CKR_OK;
}